

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void google::protobuf::Field::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Nonnull<const_char_*> pcVar4;
  undefined8 extraout_RAX;
  Arena *pAVar5;
  string *psVar6;
  pointer unaff_R15;
  string local_40;
  
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
      protobuf::internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
                 (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_,
                 Arena::CopyConstruct<google::protobuf::Option>);
    }
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((char)uVar1 != '\0') {
      if ((uVar1 & 1) != 0) {
        psVar6 = (string *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
        if (psVar6->_M_string_length == 0) {
          if (((ulong)to_msg[3]._vptr_MessageLite & 3) == 0) {
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,anon_var_dwarf_a12c75 + 5);
            *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
            pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            protobuf::internal::ArenaStringPtr::Set<>
                      ((ArenaStringPtr *)(to_msg + 3),&local_40,pAVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 1;
          pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 3),psVar6,pAVar5);
        }
      }
      if ((uVar1 & 2) != 0) {
        psVar6 = (string *)(from_msg[3]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
        if (psVar6->_M_string_length == 0) {
          if ((to_msg[3]._internal_metadata_.ptr_ & 3) == 0) {
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,anon_var_dwarf_a12c75 + 5);
            *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
            pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            protobuf::internal::ArenaStringPtr::Set<>
                      ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,&local_40,pAVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 2;
          pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)&to_msg[3]._internal_metadata_,psVar6,pAVar5);
        }
      }
      if ((uVar1 & 4) != 0) {
        psVar6 = (string *)((ulong)from_msg[4]._vptr_MessageLite & 0xfffffffffffffffc);
        if (psVar6->_M_string_length == 0) {
          if (((ulong)to_msg[4]._vptr_MessageLite & 3) == 0) {
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,anon_var_dwarf_a12c75 + 5);
            *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
            pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            protobuf::internal::ArenaStringPtr::Set<>
                      ((ArenaStringPtr *)(to_msg + 4),&local_40,pAVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 4;
          pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(to_msg + 4),psVar6,pAVar5);
        }
      }
      if ((uVar1 & 8) != 0) {
        psVar6 = (string *)(from_msg[4]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
        if (psVar6->_M_string_length == 0) {
          if ((to_msg[4]._internal_metadata_.ptr_ & 3) == 0) {
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,anon_var_dwarf_a12c75 + 5);
            *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
            pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            protobuf::internal::ArenaStringPtr::Set<>
                      ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,&local_40,pAVar5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          *(byte *)&to_msg[1]._vptr_MessageLite = *(byte *)&to_msg[1]._vptr_MessageLite | 8;
          pAVar5 = (Arena *)(to_msg->_internal_metadata_).ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          protobuf::internal::ArenaStringPtr::Set<>
                    ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,psVar6,pAVar5);
        }
      }
      if (((uVar1 & 0x10) != 0) && (*(int *)&from_msg[5]._vptr_MessageLite != 0)) {
        *(int *)&to_msg[5]._vptr_MessageLite = *(int *)&from_msg[5]._vptr_MessageLite;
      }
      if (((uVar1 & 0x20) != 0) &&
         (iVar2 = *(int *)((long)&from_msg[5]._vptr_MessageLite + 4), iVar2 != 0)) {
        *(int *)((long)&to_msg[5]._vptr_MessageLite + 4) = iVar2;
      }
      if (((uVar1 & 0x40) != 0) && (iVar2 = (int)from_msg[5]._internal_metadata_.ptr_, iVar2 != 0))
      {
        *(int *)&to_msg[5]._internal_metadata_.ptr_ = iVar2;
      }
      if (((char)uVar1 < '\0') &&
         (iVar2 = *(int *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
        *(int *)((long)&to_msg[5]._internal_metadata_.ptr_ + 4) = iVar2;
      }
    }
    if (((uVar1 >> 8 & 1) != 0) && (*(char *)&from_msg[6]._vptr_MessageLite == '\x01')) {
      *(undefined1 *)&to_msg[6]._vptr_MessageLite = 1;
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar3 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar3 & 1) != 0) {
      protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
                (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8))
      ;
    }
    return;
  }
  MergeImpl();
  if (local_40._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Field::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Field*>(&to_msg);
  auto& from = static_cast<const Field&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Field)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_type_url().empty()) {
        _this->_internal_set_type_url(from._internal_type_url());
      } else {
        if (_this->_impl_.type_url_.IsDefault()) {
          _this->_internal_set_type_url("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_json_name().empty()) {
        _this->_internal_set_json_name(from._internal_json_name());
      } else {
        if (_this->_impl_.json_name_.IsDefault()) {
          _this->_internal_set_json_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_default_value().empty()) {
        _this->_internal_set_default_value(from._internal_default_value());
      } else {
        if (_this->_impl_.default_value_.IsDefault()) {
          _this->_internal_set_default_value("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_kind() != 0) {
        _this->_impl_.kind_ = from._impl_.kind_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_cardinality() != 0) {
        _this->_impl_.cardinality_ = from._impl_.cardinality_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_number() != 0) {
        _this->_impl_.number_ = from._impl_.number_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_oneof_index() != 0) {
        _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
      }
    }
  }
  if ((cached_has_bits & 0x00000100u) != 0) {
    if (from._internal_packed() != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}